

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  QDebug QVar2;
  char16_t *pcVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QCoreApplication a;
  ExampleConfig example;
  QDebug local_c8;
  QString local_c0;
  QString local_a8;
  undefined8 local_90;
  int local_7c;
  QCoreApplication local_78 [16];
  ExampleConfig local_68;
  
  local_7c = argc;
  QCoreApplication::QCoreApplication(local_78,&local_7c,argv,0x60204);
  QVar4.m_data = (storage_type *)0x12;
  QVar4.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar4);
  local_a8.d.d._0_4_ = SUB84(local_68.super_MConfig.super_MBaseConfig._vptr_MBaseConfig,0);
  local_a8.d.d._4_4_ =
       (undefined4)((ulong)local_68.super_MConfig.super_MBaseConfig._vptr_MBaseConfig >> 0x20);
  local_a8.d.ptr._0_4_ = SUB84(local_68.super_MConfig.super_MBaseConfig.m_groupName.d.d,0);
  local_a8.d.ptr._4_4_ =
       (undefined4)((ulong)local_68.super_MConfig.super_MBaseConfig.m_groupName.d.d >> 0x20);
  local_a8.d.size._0_4_ = SUB84(local_68.super_MConfig.super_MBaseConfig.m_groupName.d.ptr,0);
  local_a8.d.size._4_4_ =
       (undefined4)((ulong)local_68.super_MConfig.super_MBaseConfig.m_groupName.d.ptr >> 0x20);
  QCoreApplication::setApplicationName(&local_a8);
  piVar1 = (int *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_),2,8);
    }
  }
  QVar5.m_data = (storage_type *)0x4;
  QVar5.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar5);
  local_a8.d.d._0_4_ = SUB84(local_68.super_MConfig.super_MBaseConfig._vptr_MBaseConfig,0);
  local_a8.d.d._4_4_ =
       (undefined4)((ulong)local_68.super_MConfig.super_MBaseConfig._vptr_MBaseConfig >> 0x20);
  local_a8.d.ptr._0_4_ = SUB84(local_68.super_MConfig.super_MBaseConfig.m_groupName.d.d,0);
  local_a8.d.ptr._4_4_ =
       (undefined4)((ulong)local_68.super_MConfig.super_MBaseConfig.m_groupName.d.d >> 0x20);
  local_a8.d.size._0_4_ = SUB84(local_68.super_MConfig.super_MBaseConfig.m_groupName.d.ptr,0);
  local_a8.d.size._4_4_ =
       (undefined4)((ulong)local_68.super_MConfig.super_MBaseConfig.m_groupName.d.ptr >> 0x20);
  QCoreApplication::setOrganizationName(&local_a8);
  piVar1 = (int *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_),2,8);
    }
  }
  ExampleConfig::ExampleConfig(&local_68);
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_a8.d.d._0_4_ = 2;
    local_a8.d.d._4_4_ = 0;
    local_a8.d.ptr._0_4_ = 0;
    local_a8.d.ptr._4_4_ = 0;
    local_a8.d.size._0_4_ = 0;
    local_a8.d.size._4_4_ = 0;
    local_90 = coreMain()::category._8_8_;
    QMessageLogger::debug();
    QVar2.stream = local_c8.stream;
    QVar6.m_data = (storage_type *)0x14;
    QVar6.m_size = (qsizetype)&local_c0;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<((QTextStream *)QVar2.stream,&local_c0);
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    QCoreApplication::applicationName();
    pcVar3 = local_c0.d.ptr;
    if (local_c0.d.ptr == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_c8,(ulong)pcVar3);
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
    QDebug::~QDebug(&local_c8);
  }
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_a8.d.d._0_4_ = 2;
    local_a8.d.d._4_4_ = 0;
    local_a8.d.ptr._0_4_ = 0;
    local_a8.d.ptr._4_4_ = 0;
    local_a8.d.size._0_4_ = 0;
    local_a8.d.size._4_4_ = 0;
    local_90 = coreMain()::category._8_8_;
    QMessageLogger::debug();
    QVar2.stream = local_c8.stream;
    QVar7.m_data = (storage_type *)0x11;
    QVar7.m_size = (qsizetype)&local_c0;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)QVar2.stream,&local_c0);
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_c8.stream,local_68.exampleValue);
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    QDebug::~QDebug(&local_c8);
  }
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_a8.d.d._0_4_ = 2;
    local_a8.d.d._4_4_ = 0;
    local_a8.d.ptr._0_4_ = 0;
    local_a8.d.ptr._4_4_ = 0;
    local_a8.d.size._0_4_ = 0;
    local_a8.d.size._4_4_ = 0;
    local_90 = coreMain()::category._8_8_;
    QMessageLogger::debug();
    QVar2.stream = local_c8.stream;
    QVar8.m_data = (storage_type *)0x12;
    QVar8.m_size = (qsizetype)&local_c0;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<((QTextStream *)QVar2.stream,&local_c0);
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    if (local_68.exampleString.d.ptr == (char *)0x0) {
      local_68.exampleString.d.ptr = (char *)&QByteArray::_empty;
    }
    QDebug::putByteArray
              ((char *)&local_c8,(ulong)local_68.exampleString.d.ptr,
               (Latin1Content)local_68.exampleString.d.size);
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    QDebug::~QDebug(&local_c8);
  }
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_a8.d.d._0_4_ = 2;
    local_a8.d.d._4_4_ = 0;
    local_a8.d.ptr._0_4_ = 0;
    local_a8.d.ptr._4_4_ = 0;
    local_a8.d.size._0_4_ = 0;
    local_a8.d.size._4_4_ = 0;
    local_90 = coreMain()::category._8_8_;
    QMessageLogger::debug();
    QVar2.stream = local_c8.stream;
    QVar9.m_data = (storage_type *)0x1e;
    QVar9.m_size = (qsizetype)&local_c0;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)QVar2.stream,&local_c0);
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    MBaseConfig::filePath(&local_c0,(MBaseConfig *)&local_68);
    if (local_c0.d.ptr == (char16_t *)0x0) {
      local_c0.d.ptr = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_c8,(ulong)local_c0.d.ptr);
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
    QDebug::~QDebug(&local_c8);
  }
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_a8.d.d._0_4_ = 2;
    local_a8.d.d._4_4_ = 0;
    local_a8.d.ptr._0_4_ = 0;
    local_a8.d.ptr._4_4_ = 0;
    local_a8.d.size._0_4_ = 0;
    local_a8.d.size._4_4_ = 0;
    local_90 = coreMain()::category._8_8_;
    QMessageLogger::debug();
    QVar2.stream = local_c8.stream;
    QVar10.m_data = (storage_type *)0x63;
    QVar10.m_size = (qsizetype)&local_c0;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar2.stream,&local_c0);
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    QDebug::~QDebug(&local_c8);
  }
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_a8.d.d._0_4_ = 2;
    local_a8.d.d._4_4_ = 0;
    local_a8.d.ptr._0_4_ = 0;
    local_a8.d.ptr._4_4_ = 0;
    local_a8.d.size._0_4_ = 0;
    local_a8.d.size._4_4_ = 0;
    local_90 = coreMain()::category._8_8_;
    QMessageLogger::debug();
    QVar2.stream = local_c8.stream;
    QVar11.m_data = (storage_type *)0x65;
    QVar11.m_size = (qsizetype)&local_c0;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)QVar2.stream,&local_c0);
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
      }
    }
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    QDebug::~QDebug(&local_c8);
  }
  ExampleConfig::~ExampleConfig(&local_68);
  QCoreApplication::~QCoreApplication(local_78);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    QCoreApplication a(argc, argv);
    a.setApplicationName("Example config app");
    a.setOrganizationName("Milo");

    ExampleConfig example;
    qCDebug(coreMain) << "Application name is:" << a.applicationName();
    qCDebug(coreMain) << "Example value is:" << example.exampleValue;
    qCDebug(coreMain) << "Example string is:" << example.exampleString;
    qCDebug(coreMain) << "Config file would be saved to:" << example.filePath();
    qCDebug(coreMain) << "Uncomment load and save in ExampleConfig class if you actually want to create and use config file. ";
    qCDebug(coreMain) << "If you want to encrypt your config add mcrypto to the project and enable build option: mconfig-crypto";

    return 0;
}